

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockTests.cpp
# Opt level: O3

int __thiscall deqp::UniformBlockTests::init(UniformBlockTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  GLSLVersion GVar2;
  BufferMode BVar3;
  Context *pCVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  bool bVar11;
  int extraout_EAX;
  TestNode *pTVar12;
  char *pcVar13;
  TestNode *pTVar14;
  TestNode *node;
  long *plVar15;
  undefined8 uVar16;
  UniformBlockCase *pUVar17;
  long lVar18;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  anon_struct_16_2_f7718127 *paVar19;
  long *plVar20;
  size_type *psVar21;
  anon_struct_16_2_f7718127 *paVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  VarType local_150;
  long lStack_138;
  TestNode *local_130;
  string name;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  TestNode *local_b8;
  anon_struct_16_2_f7718127 *local_b0;
  allocator<char> local_a1;
  TestNode *local_a0;
  VarType local_98;
  long lStack_80;
  TestNode *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  TestNode *local_50;
  VarType local_48;
  
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_type","Single basic variable in single buffer");
  local_50 = pTVar12;
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  lVar24 = 0;
  do {
    pTVar12 = (TestNode *)operator_new(0x70);
    local_78 = (TestNode *)lVar24;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[lVar24].name,glcts::fixed_sample_locations_values + 1);
    local_a0 = (TestNode *)(init::layoutFlags + lVar24);
    tcu::TestNode::addChild(local_50,pTVar12);
    paVar19 = (anon_struct_16_2_f7718127 *)0x0;
    do {
      DVar1 = init::basicTypes[(long)paVar19];
      pcVar13 = glu::getDataTypeName(DVar1);
      uVar23 = ((uint)paVar19 & 1) * 0x100 + 0x100;
      if ((*(uint *)&local_a0->m_testCtx & 0x10) == 0) {
        uVar23 = 0x300;
      }
      uVar23 = uVar23 | *(uint *)&local_a0->m_testCtx;
      local_b8 = (TestNode *)paVar19;
      if (DVar1 - TYPE_BOOL < 4) {
        pTVar14 = (TestNode *)operator_new(0xb0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        GVar2 = this->m_glslVersion;
        ub::VarType::VarType((VarType *)&name,DVar1,0);
        BlockBasicTypeCase::BlockBasicTypeCase
                  ((BlockBasicTypeCase *)pTVar14,pCVar4,pcVar13,
                   glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar23,0);
        tcu::TestNode::addChild(pTVar12,pTVar14);
        ub::VarType::~VarType((VarType *)&name);
      }
      else {
        lVar24 = 8;
        do {
          pTVar14 = (TestNode *)operator_new(0xb0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,*(char **)((long)&PTR_iterate_0210c398 + lVar24),
                     (allocator<char> *)local_70);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_150._0_8_ = (long)&local_150 + 0x10;
          plVar20 = plVar15 + 2;
          if ((long *)*plVar15 == plVar20) {
            local_150.m_data._8_8_ = *plVar20;
            lStack_138 = plVar15[3];
          }
          else {
            local_150.m_data._8_8_ = *plVar20;
            local_150._0_8_ = (long *)*plVar15;
          }
          local_150.m_data.array.elementType = (VarType *)plVar15[1];
          *plVar15 = (long)plVar20;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar21 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar21) {
            name.field_2._M_allocated_capacity = *psVar21;
            name.field_2._8_8_ = plVar15[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar21;
            name._M_dataplus._M_p = (pointer)*plVar15;
          }
          _Var9._M_p = name._M_dataplus._M_p;
          name._M_string_length = plVar15[1];
          *plVar15 = (long)psVar21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          GVar2 = this->m_glslVersion;
          local_130 = pTVar14;
          ub::VarType::VarType
                    (&local_98,DVar1,*(deUint32 *)((long)&init::precisionFlags[0].name + lVar24));
          pTVar14 = local_130;
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)local_130,pCVar4,_Var9._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,&local_98,uVar23,0);
          tcu::TestNode::addChild(pTVar12,pTVar14);
          ub::VarType::~VarType(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          lVar24 = lVar24 + 0x10;
        } while (lVar24 != 0x38);
      }
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        uVar16 = CONCAT71((uint7)(uint3)(DVar1 - TYPE_FLOAT_MAT2 >> 8),1);
        lVar24 = 0;
        do {
          local_b0 = (anon_struct_16_2_f7718127 *)CONCAT44(local_b0._4_4_,(int)uVar16);
          pTVar14 = (TestNode *)(init::matrixFlags + lVar24);
          lVar24 = 8;
          local_130 = pTVar14;
          do {
            node = (TestNode *)operator_new(0xb0);
            pCVar4 = (this->super_TestCaseGroup).m_context;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_70,(char *)pTVar14->_vptr_TestNode,&local_a1);
            plVar15 = (long *)std::__cxx11::string::append((char *)local_70);
            plVar20 = plVar15 + 2;
            if ((long *)*plVar15 == plVar20) {
              local_98.m_data._8_8_ = *plVar20;
              lStack_80 = plVar15[3];
              local_98._0_8_ = (long)&local_98 + 0x10;
            }
            else {
              local_98.m_data._8_8_ = *plVar20;
              local_98._0_8_ = (long *)*plVar15;
            }
            local_98.m_data.array.elementType = (VarType *)plVar15[1];
            *plVar15 = (long)plVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_98);
            local_d8 = &local_c8;
            plVar20 = plVar15 + 2;
            if ((long *)*plVar15 == plVar20) {
              local_c8 = *plVar20;
              lStack_c0 = plVar15[3];
            }
            else {
              local_c8 = *plVar20;
              local_d8 = (long *)*plVar15;
            }
            local_d0 = plVar15[1];
            *plVar15 = (long)plVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
            local_150._0_8_ = (long)&local_150 + 0x10;
            plVar20 = plVar15 + 2;
            if ((long *)*plVar15 == plVar20) {
              local_150.m_data._8_8_ = *plVar20;
              lStack_138 = plVar15[3];
            }
            else {
              local_150.m_data._8_8_ = *plVar20;
              local_150._0_8_ = (long *)*plVar15;
            }
            local_150.m_data.array.elementType = (VarType *)plVar15[1];
            *plVar15 = (long)plVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
            name._M_dataplus._M_p = (pointer)&name.field_2;
            psVar21 = (size_type *)(plVar15 + 2);
            if ((size_type *)*plVar15 == psVar21) {
              name.field_2._M_allocated_capacity = *psVar21;
              name.field_2._8_8_ = plVar15[3];
            }
            else {
              name.field_2._M_allocated_capacity = *psVar21;
              name._M_dataplus._M_p = (pointer)*plVar15;
            }
            _Var9._M_p = name._M_dataplus._M_p;
            name._M_string_length = plVar15[1];
            *plVar15 = (long)psVar21;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            GVar2 = this->m_glslVersion;
            ub::VarType::VarType
                      (&local_48,DVar1,*(deUint32 *)((long)&init::precisionFlags[0].name + lVar24));
            BlockBasicTypeCase::BlockBasicTypeCase
                      ((BlockBasicTypeCase *)node,pCVar4,_Var9._M_p,
                       glcts::fixed_sample_locations_values + 1,GVar2,&local_48,
                       *(uint *)&local_130->m_testCtx | uVar23,0);
            tcu::TestNode::addChild(pTVar12,node);
            ub::VarType::~VarType(&local_48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            pTVar14 = local_130;
            if (local_150._0_8_ != (long)&local_150 + 0x10U) {
              operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
            }
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            if (local_98._0_8_ != (long)&local_98 + 0x10U) {
              operator_delete((void *)local_98._0_8_,local_98.m_data._8_8_ + 1);
            }
            if (local_70[0] != (undefined1 *)((long)&((VarType *)local_70)->m_data + 8U)) {
              operator_delete(local_70[0],local_60._0_8_ + 1);
            }
            lVar24 = lVar24 + 0x10;
          } while (lVar24 != 0x38);
          lVar24 = 1;
          uVar16 = 0;
        } while (((ulong)local_b0 & 1) != 0);
      }
      paVar19 = (anon_struct_16_2_f7718127 *)((long)&local_b8->_vptr_TestNode + 1);
    } while (paVar19 != (anon_struct_16_2_f7718127 *)0x19);
    lVar24 = (long)local_78 + 1;
  } while (lVar24 != 3);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_basic_array","Single basic array variable in single buffer");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  paVar19 = (anon_struct_16_2_f7718127 *)0x0;
  local_78 = pTVar12;
  do {
    pTVar12 = local_78;
    pTVar14 = (TestNode *)operator_new(0x70);
    local_a0 = (TestNode *)paVar19;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar14,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(long)paVar19].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar12,pTVar14);
    paVar22 = (anon_struct_16_2_f7718127 *)0x0;
    local_b8 = (TestNode *)(init::layoutFlags + (long)paVar19);
    do {
      pTVar12 = local_b8;
      DVar1 = init::basicTypes[(long)paVar22];
      pcVar13 = glu::getDataTypeName(DVar1);
      uVar23 = *(uint *)&pTVar12->m_testCtx;
      uVar25 = ((uint)paVar22 & 1) * 0x100 + 0x100;
      if ((uVar23 & 0x10) == 0) {
        uVar25 = 0x300;
      }
      local_b0 = paVar22;
      local_130 = (TestNode *)operator_new(0xb0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      GVar2 = this->m_glslVersion;
      ub::VarType::VarType(&local_150,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      ub::VarType::VarType((VarType *)&name,&local_150,3);
      pTVar12 = local_130;
      uVar25 = uVar25 | uVar23;
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)local_130,pCVar4,pcVar13,
                 glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar25,0);
      tcu::TestNode::addChild(pTVar14,pTVar12);
      ub::VarType::~VarType((VarType *)&name);
      ub::VarType::~VarType(&local_150);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        lVar24 = 0;
        bVar7 = true;
        do {
          bVar11 = bVar7;
          local_130 = (TestNode *)operator_new(0xb0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,init::matrixFlags[lVar24].name,(allocator<char> *)&local_48
                    );
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_150._0_8_ = (long)&local_150 + 0x10;
          plVar20 = plVar15 + 2;
          if ((long *)*plVar15 == plVar20) {
            local_150.m_data._8_8_ = *plVar20;
            lStack_138 = plVar15[3];
          }
          else {
            local_150.m_data._8_8_ = *plVar20;
            local_150._0_8_ = (long *)*plVar15;
          }
          local_150.m_data.array.elementType = (VarType *)plVar15[1];
          *plVar15 = (long)plVar20;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar21 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar21) {
            name.field_2._M_allocated_capacity = *psVar21;
            name.field_2._8_8_ = plVar15[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar21;
            name._M_dataplus._M_p = (pointer)*plVar15;
          }
          _Var9._M_p = name._M_dataplus._M_p;
          name._M_string_length = plVar15[1];
          *plVar15 = (long)psVar21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          GVar2 = this->m_glslVersion;
          ub::VarType::VarType((VarType *)local_70,DVar1,4);
          ub::VarType::VarType(&local_98,(VarType *)local_70,3);
          pTVar12 = local_130;
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)local_130,pCVar4,_Var9._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,&local_98,
                     init::matrixFlags[lVar24].flags | uVar25,0);
          tcu::TestNode::addChild(pTVar14,pTVar12);
          ub::VarType::~VarType(&local_98);
          ub::VarType::~VarType((VarType *)local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          lVar24 = 1;
          bVar7 = false;
        } while (bVar11);
      }
      paVar22 = (anon_struct_16_2_f7718127 *)((long)&local_b0->name + 1);
    } while (paVar22 != (anon_struct_16_2_f7718127 *)0x19);
    paVar19 = (anon_struct_16_2_f7718127 *)((long)&local_a0->_vptr_TestNode + 1);
  } while (paVar19 != (anon_struct_16_2_f7718127 *)0x3);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct","Single struct in uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  lVar24 = 0;
  bVar7 = true;
  do {
    bVar11 = bVar7;
    pcVar13 = init::bufferModes[lVar24].name;
    lVar18 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar18);
      bVar7 = false;
      bVar10 = true;
      do {
        bVar8 = bVar10;
        pTVar14 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar13,(allocator<char> *)&local_98);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar20 = plVar15 + 2;
        if ((long *)*plVar15 == plVar20) {
          local_150.m_data._8_8_ = *plVar20;
          lStack_138 = plVar15[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar20;
          local_150._0_8_ = (long *)*plVar15;
        }
        local_150.m_data.array.elementType = (VarType *)plVar15[1];
        *plVar15 = (long)plVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar21 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar21) {
          name.field_2._M_allocated_capacity = *psVar21;
          name.field_2._8_8_ = plVar15[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar21;
          name._M_dataplus._M_p = (pointer)*plVar15;
        }
        name._M_string_length = plVar15[1];
        *plVar15 = (long)psVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar23 = *(uint *)&pTVar14->m_testCtx;
        BVar3 = init::bufferModes[lVar24].mode;
        if (bVar7 || BVar3 != BUFFERMODE_SINGLE) {
          if (!bVar8) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar17 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar17,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0210c4d0;
          *(uint *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar23 & 0x10) == 0) << 9 | uVar23 | 0x100;
          *(uint *)((long)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(byte)~bVar8 * 3;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        bVar7 = true;
        bVar10 = false;
      } while (bVar8);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar24 = 1;
    bVar7 = false;
  } while (bVar11);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_struct_array","Struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  lVar24 = 0;
  bVar7 = true;
  do {
    bVar11 = bVar7;
    pcVar13 = init::bufferModes[lVar24].name;
    lVar18 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar18);
      bVar7 = false;
      bVar10 = true;
      do {
        bVar8 = bVar10;
        pTVar14 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar13,(allocator<char> *)&local_98);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar20 = plVar15 + 2;
        if ((long *)*plVar15 == plVar20) {
          local_150.m_data._8_8_ = *plVar20;
          lStack_138 = plVar15[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar20;
          local_150._0_8_ = (long *)*plVar15;
        }
        local_150.m_data.array.elementType = (VarType *)plVar15[1];
        *plVar15 = (long)plVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar21 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar21) {
          name.field_2._M_allocated_capacity = *psVar21;
          name.field_2._8_8_ = plVar15[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar21;
          name._M_dataplus._M_p = (pointer)*plVar15;
        }
        name._M_string_length = plVar15[1];
        *plVar15 = (long)psVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar23 = *(uint *)&pTVar14->m_testCtx;
        BVar3 = init::bufferModes[lVar24].mode;
        if (bVar7 || BVar3 != BUFFERMODE_SINGLE) {
          if (!bVar8) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar17 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar17,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0210c520;
          *(uint *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar23 & 0x10) == 0) << 8 | uVar23 | 0x200;
          *(uint *)((long)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(byte)~bVar8 * 3;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        bVar7 = true;
        bVar10 = false;
      } while (bVar8);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar24 = 1;
    bVar7 = false;
  } while (bVar11);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct","Nested struct in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  lVar24 = 0;
  bVar7 = true;
  do {
    bVar11 = bVar7;
    pcVar13 = init::bufferModes[lVar24].name;
    lVar18 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar18);
      bVar7 = false;
      bVar10 = true;
      do {
        bVar8 = bVar10;
        pTVar14 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar13,(allocator<char> *)&local_98);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar20 = plVar15 + 2;
        if ((long *)*plVar15 == plVar20) {
          local_150.m_data._8_8_ = *plVar20;
          lStack_138 = plVar15[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar20;
          local_150._0_8_ = (long *)*plVar15;
        }
        local_150.m_data.array.elementType = (VarType *)plVar15[1];
        *plVar15 = (long)plVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar21 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar21) {
          name.field_2._M_allocated_capacity = *psVar21;
          name.field_2._8_8_ = plVar15[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar21;
          name._M_dataplus._M_p = (pointer)*plVar15;
        }
        name._M_string_length = plVar15[1];
        *plVar15 = (long)psVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar23 = *(uint *)&pTVar14->m_testCtx;
        BVar3 = init::bufferModes[lVar24].mode;
        if (bVar7 || BVar3 != BUFFERMODE_SINGLE) {
          if (!bVar8) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar17 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar17,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0210c570;
          *(uint *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar23 & 0x10) == 0) << 9 | uVar23 | 0x100;
          *(uint *)((long)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(byte)~bVar8 * 3;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        bVar7 = true;
        bVar10 = false;
      } while (bVar8);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar24 = 1;
    bVar7 = false;
  } while (bVar11);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "single_nested_struct_array","Nested struct array in one uniform block");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  lVar24 = 0;
  bVar7 = true;
  do {
    bVar11 = bVar7;
    pcVar13 = init::bufferModes[lVar24].name;
    lVar18 = 0;
    do {
      local_130 = (TestNode *)(init::layoutFlags + lVar18);
      bVar7 = false;
      bVar10 = true;
      do {
        bVar8 = bVar10;
        pTVar14 = local_130;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,pcVar13,(allocator<char> *)&local_98);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_150._0_8_ = (long)&local_150 + 0x10;
        plVar20 = plVar15 + 2;
        if ((long *)*plVar15 == plVar20) {
          local_150.m_data._8_8_ = *plVar20;
          lStack_138 = plVar15[3];
        }
        else {
          local_150.m_data._8_8_ = *plVar20;
          local_150._0_8_ = (long *)*plVar15;
        }
        local_150.m_data.array.elementType = (VarType *)plVar15[1];
        *plVar15 = (long)plVar20;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
        name._M_dataplus._M_p = (pointer)&name.field_2;
        psVar21 = (size_type *)(plVar15 + 2);
        if ((size_type *)*plVar15 == psVar21) {
          name.field_2._M_allocated_capacity = *psVar21;
          name.field_2._8_8_ = plVar15[3];
        }
        else {
          name.field_2._M_allocated_capacity = *psVar21;
          name._M_dataplus._M_p = (pointer)*plVar15;
        }
        name._M_string_length = plVar15[1];
        *plVar15 = (long)psVar21;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        uVar23 = *(uint *)&pTVar14->m_testCtx;
        BVar3 = init::bufferModes[lVar24].mode;
        if (bVar7 || BVar3 != BUFFERMODE_SINGLE) {
          if (!bVar8) {
            std::__cxx11::string::append((char *)&name);
          }
          pUVar17 = (UniformBlockCase *)operator_new(0xb8);
          UniformBlockCase::UniformBlockCase
                    (pUVar17,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     glcts::fixed_sample_locations_values + 1,this->m_glslVersion,BVar3);
          (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0210c5c0;
          *(uint *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               (uint)((uVar23 & 0x10) == 0) << 8 | uVar23 | 0x200;
          *(uint *)((long)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = (uint)(byte)~bVar8 * 3;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        bVar7 = true;
        bVar10 = false;
      } while (bVar8);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar24 = 1;
    bVar7 = false;
  } while (bVar11);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "instance_array_basic_type","Single basic variable in instance array");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  paVar19 = (anon_struct_16_2_f7718127 *)0x0;
  local_a0 = pTVar12;
  do {
    pTVar12 = local_a0;
    pTVar14 = (TestNode *)operator_new(0x70);
    local_b8 = (TestNode *)paVar19;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar14,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::layoutFlags[(long)paVar19].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(pTVar12,pTVar14);
    lVar24 = 0;
    local_b0 = init::layoutFlags + (long)paVar19;
    do {
      paVar19 = local_b0;
      DVar1 = init::basicTypes[lVar24];
      pcVar13 = glu::getDataTypeName(DVar1);
      uVar23 = paVar19->flags;
      uVar25 = ((uint)lVar24 & 1) * 0x100 + 0x100;
      if ((uVar23 & 0x10) == 0) {
        uVar25 = 0x300;
      }
      local_130 = (TestNode *)operator_new(0xb0);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      GVar2 = this->m_glslVersion;
      ub::VarType::VarType((VarType *)&name,DVar1,(uint)(3 < DVar1 - TYPE_BOOL) << 2);
      pTVar12 = local_130;
      BlockBasicTypeCase::BlockBasicTypeCase
                ((BlockBasicTypeCase *)local_130,pCVar4,pcVar13,
                 glcts::fixed_sample_locations_values + 1,GVar2,(VarType *)&name,uVar25 | uVar23,3);
      tcu::TestNode::addChild(pTVar14,pTVar12);
      ub::VarType::~VarType((VarType *)&name);
      if (DVar1 - TYPE_FLOAT_MAT2 < 9 || DVar1 - TYPE_DOUBLE_MAT2 < 9) {
        uVar16 = CONCAT71((uint7)(uint3)(uVar23 >> 8),1);
        lVar18 = 0;
        do {
          pTVar12 = (TestNode *)operator_new(0xb0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,init::matrixFlags[lVar18].name,(allocator<char> *)local_70)
          ;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_150._0_8_ = (long)&local_150 + 0x10;
          plVar20 = plVar15 + 2;
          if ((long *)*plVar15 == plVar20) {
            local_150.m_data._8_8_ = *plVar20;
            lStack_138 = plVar15[3];
          }
          else {
            local_150.m_data._8_8_ = *plVar20;
            local_150._0_8_ = (long *)*plVar15;
          }
          local_150.m_data.array.elementType = (VarType *)plVar15[1];
          *plVar15 = (long)plVar20;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
          local_130 = (TestNode *)CONCAT44(local_130._4_4_,(int)uVar16);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar21 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar21) {
            name.field_2._M_allocated_capacity = *psVar21;
            name.field_2._8_8_ = plVar15[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar21;
            name._M_dataplus._M_p = (pointer)*plVar15;
          }
          _Var9._M_p = name._M_dataplus._M_p;
          name._M_string_length = plVar15[1];
          *plVar15 = (long)psVar21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          GVar2 = this->m_glslVersion;
          ub::VarType::VarType(&local_98,DVar1,4);
          BlockBasicTypeCase::BlockBasicTypeCase
                    ((BlockBasicTypeCase *)pTVar12,pCVar4,_Var9._M_p,
                     glcts::fixed_sample_locations_values + 1,GVar2,&local_98,
                     init::matrixFlags[lVar18].flags | uVar25 | uVar23,3);
          tcu::TestNode::addChild(pTVar14,pTVar12);
          ub::VarType::~VarType(&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          pTVar12 = local_130;
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          lVar18 = 1;
          uVar16 = 0;
        } while (((ulong)pTVar12 & 1) != 0);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x19);
    paVar19 = (anon_struct_16_2_f7718127 *)((long)&local_b8->_vptr_TestNode + 1);
  } while (paVar19 != (anon_struct_16_2_f7718127 *)0x3);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_basic_types","Multiple buffers with basic types");
  local_b8 = pTVar12;
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  uVar16 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  lVar24 = 0;
  do {
    local_b0 = (anon_struct_16_2_f7718127 *)CONCAT44(local_b0._4_4_,(int)uVar16);
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[lVar24].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(local_b8,pTVar12);
    lVar18 = 0;
    do {
      pcVar13 = init::layoutFlags[lVar18].name;
      local_130 = (TestNode *)CONCAT44(local_130._4_4_,(int)CONCAT71((int7)((ulong)pcVar13 >> 8),1))
      ;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar13,(allocator<char> *)&local_150);
        uVar23 = init::layoutFlags[lVar18].flags;
        if (((ulong)local_130 & 1) == 0) {
          std::__cxx11::string::append((char *)&name);
        }
        pUVar17 = (UniformBlockCase *)operator_new(0xc0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        local_150._0_8_ = (long)&local_150 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&local_150);
        BVar3 = init::bufferModes[lVar24].mode;
        UniformBlockCase::UniformBlockCase
                  (pUVar17,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1,
                   this->m_glslVersion,BVar3);
        iVar6 = ((byte)~(byte)local_130 & 1) * 3;
        uVar5 = (ulong)DAT_01b83d00;
        (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0210c610;
        pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)(CONCAT44(uVar23,uVar23) | uVar5);
        *(int *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar6;
        tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if ((uVar23 & 0x10) == 0) {
          pUVar17 = (UniformBlockCase *)operator_new(0xc0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          local_150._0_8_ = (long)&local_150 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&local_150);
          UniformBlockCase::UniformBlockCase
                    (pUVar17,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1
                     ,this->m_glslVersion,BVar3);
          (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0210c610;
          *(uint *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               uVar23 | 0x300;
          *(uint *)((long)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = uVar23 | 0x300;
          *(int *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar6;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        uVar5 = (ulong)local_130 & 1;
        local_130 = (TestNode *)((ulong)local_130 & 0xffffffff00000000);
      } while (uVar5 != 0);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar24 = 1;
    uVar16 = 0;
  } while (((ulong)local_b0 & 1) != 0);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "multi_nested_struct","Multiple buffers with nested structs");
  local_b8 = pTVar12;
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  uVar16 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
  lVar24 = 0;
  do {
    local_b0 = (anon_struct_16_2_f7718127 *)CONCAT44(local_b0._4_4_,(int)uVar16);
    pTVar12 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar12,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::bufferModes[lVar24].name,glcts::fixed_sample_locations_values + 1);
    tcu::TestNode::addChild(local_b8,pTVar12);
    lVar18 = 0;
    do {
      pcVar13 = init::layoutFlags[lVar18].name;
      local_130 = (TestNode *)CONCAT44(local_130._4_4_,(int)CONCAT71((int7)((ulong)pcVar13 >> 8),1))
      ;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,pcVar13,(allocator<char> *)&local_150);
        uVar23 = init::layoutFlags[lVar18].flags;
        if (((ulong)local_130 & 1) == 0) {
          std::__cxx11::string::append((char *)&name);
        }
        pUVar17 = (UniformBlockCase *)operator_new(0xc0);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        local_150._0_8_ = (long)&local_150 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        std::__cxx11::string::append((char *)&local_150);
        BVar3 = init::bufferModes[lVar24].mode;
        UniformBlockCase::UniformBlockCase
                  (pUVar17,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1,
                   this->m_glslVersion,BVar3);
        iVar6 = ((byte)~(byte)local_130 & 1) * 3;
        uVar5 = (ulong)DAT_01b83d00;
        (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__UniformBlockCase_0210c660;
        pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)(CONCAT44(uVar23,uVar23) | uVar5);
        *(int *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar6;
        tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
        if (local_150._0_8_ != (long)&local_150 + 0x10U) {
          operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
        }
        if ((uVar23 & 0x10) == 0) {
          pUVar17 = (UniformBlockCase *)operator_new(0xc0);
          pCVar4 = (this->super_TestCaseGroup).m_context;
          local_150._0_8_ = (long)&local_150 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          std::__cxx11::string::append((char *)&local_150);
          UniformBlockCase::UniformBlockCase
                    (pUVar17,pCVar4,(char *)local_150._0_8_,glcts::fixed_sample_locations_values + 1
                     ,this->m_glslVersion,BVar3);
          (pUVar17->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__UniformBlockCase_0210c660;
          *(uint *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               uVar23 | 0x300;
          *(uint *)((long)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode +
                   4) = uVar23 | 0x300;
          *(int *)&pUVar17[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = iVar6;
          tcu::TestNode::addChild(pTVar12,(TestNode *)pUVar17);
          if (local_150._0_8_ != (long)&local_150 + 0x10U) {
            operator_delete((void *)local_150._0_8_,local_150.m_data._8_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        uVar5 = (ulong)local_130 & 1;
        local_130 = (TestNode *)((ulong)local_130 & 0xffffffff00000000);
      } while (uVar5 != 0);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    lVar24 = 1;
    uVar16 = 0;
  } while (((ulong)local_b0 & 1) != 0);
  pTVar12 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar12,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Random Uniform Block cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar12);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"scalar_types",
             "Scalar types only, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x3fc0,
             10,0);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"vector_types",
             "Scalar and vector types only, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x3fc1,10,0x19);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"basic_types",
             "All basic types, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc3,10
             ,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"basic_arrays",
             "Arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fc7,10,0x32);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"basic_instance_arrays",
             "Basic instance arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fe3,10,0x4b);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"nested_structs",
             "Nested structs, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7fcb,10,
             100);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"nested_structs_arrays",
             "Nested structs, arrays, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0x7fcf,10,0x96);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,
             "nested_structs_instance_arrays","Nested structs, instance arrays, per-block buffers",
             this->m_glslVersion,BUFFERMODE_PER_BLOCK,0x7feb,10,0x7d);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,
             "nested_structs_arrays_instance_arrays",
             "Nested structs, instance arrays, per-block buffers",this->m_glslVersion,
             BUFFERMODE_PER_BLOCK,0x7fef,10,0xaf);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"all_per_block_buffers",
             "All random features, per-block buffers",this->m_glslVersion,BUFFERMODE_PER_BLOCK,
             0xffffffff,0x14,200);
  createRandomCaseGroup
            ((TestCaseGroup *)pTVar12,(this->super_TestCaseGroup).m_context,"all_shared_buffer",
             "All random features, shared buffer",this->m_glslVersion,BUFFERMODE_SINGLE,0xffffffff,
             0x14,0xfa);
  return extraout_EAX;
}

Assistant:

void UniformBlockTests::init(void)
{
	static const glu::DataType basicTypes[] = { glu::TYPE_FLOAT,		glu::TYPE_FLOAT_VEC2,   glu::TYPE_FLOAT_VEC3,
												glu::TYPE_FLOAT_VEC4,   glu::TYPE_INT,			glu::TYPE_INT_VEC2,
												glu::TYPE_INT_VEC3,		glu::TYPE_INT_VEC4,		glu::TYPE_UINT,
												glu::TYPE_UINT_VEC2,	glu::TYPE_UINT_VEC3,	glu::TYPE_UINT_VEC4,
												glu::TYPE_BOOL,			glu::TYPE_BOOL_VEC2,	glu::TYPE_BOOL_VEC3,
												glu::TYPE_BOOL_VEC4,	glu::TYPE_FLOAT_MAT2,   glu::TYPE_FLOAT_MAT3,
												glu::TYPE_FLOAT_MAT4,   glu::TYPE_FLOAT_MAT2X3, glu::TYPE_FLOAT_MAT2X4,
												glu::TYPE_FLOAT_MAT3X2, glu::TYPE_FLOAT_MAT3X4, glu::TYPE_FLOAT_MAT4X2,
												glu::TYPE_FLOAT_MAT4X3 };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} precisionFlags[] = { { "lowp", PRECISION_LOW }, { "mediump", PRECISION_MEDIUM }, { "highp", PRECISION_HIGH } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} layoutFlags[] = { { "shared", LAYOUT_SHARED }, { "packed", LAYOUT_PACKED }, { "std140", LAYOUT_STD140 } };

	static const struct
	{
		const char* name;
		deUint32	flags;
	} matrixFlags[] = { { "row_major", LAYOUT_ROW_MAJOR }, { "column_major", LAYOUT_COLUMN_MAJOR } };

	static const struct
	{
		const char*					 name;
		UniformBlockCase::BufferMode mode;
	} bufferModes[] = { { "per_block_buffer", UniformBlockCase::BUFFERMODE_PER_BLOCK },
						{ "single_buffer", UniformBlockCase::BUFFERMODE_SINGLE } };

	// ubo.single_basic_type
	{
		tcu::TestCaseGroup* singleBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_type", "Single basic variable in single buffer");
		addChild(singleBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				if (glu::isDataTypeBoolOrBVec(type))
					layoutGroup->addChild(new BlockBasicTypeCase(m_context, typeName, "", m_glslVersion,
																 VarType(type, 0), flags, 0 /* no instance array */));
				else
				{
					for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(precisionFlags[precNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, precisionFlags[precNdx].flags), flags,
							0 /* no instance array */));
				}

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
					{
						for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisionFlags); precNdx++)
							layoutGroup->addChild(new BlockBasicTypeCase(
								m_context,
								(string(matrixFlags[matFlagNdx].name) + "_" + precisionFlags[precNdx].name + "_" +
								 typeName)
									.c_str(),
								"", m_glslVersion, VarType(type, precisionFlags[precNdx].flags),
								flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
					}
				}
			}
		}
	}

	// ubo.single_basic_array
	{
		tcu::TestCaseGroup* singleBasicArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_basic_array", "Single basic array variable in single buffer");
		addChild(singleBasicArrayGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			singleBasicArrayGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		= basicTypes[basicTypeNdx];
				const char*   typeName  = glu::getDataTypeName(type);
				const int	 arraySize = 3;
				deUint32	  baseFlags = layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		= baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), arraySize), flags,
					0 /* no instance array */));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(VarType(type, PRECISION_HIGH), arraySize),
							flags | matrixFlags[matFlagNdx].flags, 0 /* no instance array */));
				}
			}
		}
	}

	// ubo.single_struct
	{
		tcu::TestCaseGroup* singleStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct", "Single struct in uniform block");
		addChild(singleStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructGroup->addChild(new BlockSingleStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_struct_array
	{
		tcu::TestCaseGroup* singleStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_struct_array", "Struct array in one uniform block");
		addChild(singleStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleStructArrayGroup->addChild(new BlockSingleStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct
	{
		tcu::TestCaseGroup* singleNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct", "Nested struct in one uniform block");
		addChild(singleNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_VERTEX : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructGroup->addChild(new BlockSingleNestedStructCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.single_nested_struct_array
	{
		tcu::TestCaseGroup* singleNestedStructArrayGroup =
			new tcu::TestCaseGroup(m_testCtx, "single_nested_struct_array", "Nested struct array in one uniform block");
		addChild(singleNestedStructArrayGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string name = std::string(bufferModes[modeNdx].name) + "_" + layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;
					deUint32	flags	 = baseFlags | ((baseFlags & LAYOUT_PACKED) ? DECLARE_FRAGMENT : DECLARE_BOTH);

					if (bufferModes[modeNdx].mode == UniformBlockCase::BUFFERMODE_SINGLE && isArray == 0)
						continue; // Doesn't make sense to add this variant.

					if (isArray)
						name += "_instance_array";

					singleNestedStructArrayGroup->addChild(new BlockSingleNestedStructArrayCase(
						m_context, name.c_str(), "", m_glslVersion, flags, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.instance_array_basic_type
	{
		tcu::TestCaseGroup* instanceArrayBasicTypeGroup =
			new tcu::TestCaseGroup(m_testCtx, "instance_array_basic_type", "Single basic variable in instance array");
		addChild(instanceArrayBasicTypeGroup);

		for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
		{
			tcu::TestCaseGroup* layoutGroup = new tcu::TestCaseGroup(m_testCtx, layoutFlags[layoutFlagNdx].name, "");
			instanceArrayBasicTypeGroup->addChild(layoutGroup);

			for (int basicTypeNdx = 0; basicTypeNdx < DE_LENGTH_OF_ARRAY(basicTypes); basicTypeNdx++)
			{
				glu::DataType type		   = basicTypes[basicTypeNdx];
				const char*   typeName	 = glu::getDataTypeName(type);
				const int	 numInstances = 3;
				deUint32	  baseFlags	= layoutFlags[layoutFlagNdx].flags;
				deUint32	  flags		   = baseFlags | ((baseFlags & LAYOUT_PACKED) ?
												  (basicTypeNdx % 2 == 0 ? DECLARE_VERTEX : DECLARE_FRAGMENT) :
												  DECLARE_BOTH);

				layoutGroup->addChild(new BlockBasicTypeCase(
					m_context, typeName, "", m_glslVersion,
					VarType(type, glu::isDataTypeBoolOrBVec(type) ? 0 : PRECISION_HIGH), flags, numInstances));

				if (glu::isDataTypeMatrix(type))
				{
					for (int matFlagNdx = 0; matFlagNdx < DE_LENGTH_OF_ARRAY(matrixFlags); matFlagNdx++)
						layoutGroup->addChild(new BlockBasicTypeCase(
							m_context, (string(matrixFlags[matFlagNdx].name) + "_" + typeName).c_str(), "",
							m_glslVersion, VarType(type, PRECISION_HIGH), flags | matrixFlags[matFlagNdx].flags,
							numInstances));
				}
			}
		}
	}

	// ubo.multi_basic_types
	{
		tcu::TestCaseGroup* multiBasicTypesGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_basic_types", "Multiple buffers with basic types");
		addChild(multiBasicTypesGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiBasicTypesGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiBasicTypesCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiBasicTypesCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.multi_nested_struct
	{
		tcu::TestCaseGroup* multiNestedStructGroup =
			new tcu::TestCaseGroup(m_testCtx, "multi_nested_struct", "Multiple buffers with nested structs");
		addChild(multiNestedStructGroup);

		for (int modeNdx = 0; modeNdx < DE_LENGTH_OF_ARRAY(bufferModes); modeNdx++)
		{
			tcu::TestCaseGroup* modeGroup = new tcu::TestCaseGroup(m_testCtx, bufferModes[modeNdx].name, "");
			multiNestedStructGroup->addChild(modeGroup);

			for (int layoutFlagNdx = 0; layoutFlagNdx < DE_LENGTH_OF_ARRAY(layoutFlags); layoutFlagNdx++)
			{
				for (int isArray = 0; isArray < 2; isArray++)
				{
					std::string baseName  = layoutFlags[layoutFlagNdx].name;
					deUint32	baseFlags = layoutFlags[layoutFlagNdx].flags;

					if (isArray)
						baseName += "_instance_array";

					modeGroup->addChild(new BlockMultiNestedStructCase(
						m_context, (baseName + "_mixed").c_str(), "", m_glslVersion, baseFlags | DECLARE_VERTEX,
						baseFlags | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));

					if (!(baseFlags & LAYOUT_PACKED))
						modeGroup->addChild(new BlockMultiNestedStructCase(
							m_context, (baseName + "_both").c_str(), "", m_glslVersion,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT,
							baseFlags | DECLARE_VERTEX | DECLARE_FRAGMENT, bufferModes[modeNdx].mode, isArray ? 3 : 0));
				}
			}
		}
	}

	// ubo.random
	{
		const deUint32 allShaders	= FEATURE_VERTEX_BLOCKS | FEATURE_FRAGMENT_BLOCKS | FEATURE_SHARED_BLOCKS;
		const deUint32 allLayouts	= FEATURE_PACKED_LAYOUT | FEATURE_SHARED_LAYOUT | FEATURE_STD140_LAYOUT;
		const deUint32 allBasicTypes = FEATURE_VECTORS | FEATURE_MATRICES;
		const deUint32 unused		 = FEATURE_UNUSED_MEMBERS | FEATURE_UNUSED_UNIFORMS;
		const deUint32 matFlags		 = FEATURE_MATRIX_LAYOUT;

		tcu::TestCaseGroup* randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Random Uniform Block cases");
		addChild(randomGroup);

		// Basic types.
		createRandomCaseGroup(randomGroup, m_context, "scalar_types", "Scalar types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, allShaders | allLayouts | unused,
							  10, 0);
		createRandomCaseGroup(randomGroup, m_context, "vector_types", "Scalar and vector types only, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | FEATURE_VECTORS, 10, 25);
		createRandomCaseGroup(randomGroup, m_context, "basic_types", "All basic types, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags, 10, 50);
		createRandomCaseGroup(randomGroup, m_context, "basic_arrays", "Arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_ARRAYS, 10, 50);

		createRandomCaseGroup(
			randomGroup, m_context, "basic_instance_arrays", "Basic instance arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_INSTANCE_ARRAYS, 10, 75);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs", "Nested structs, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS, 10, 100);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_arrays", "Nested structs, arrays, per-block buffers", m_glslVersion,
			UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_ARRAYS, 10, 150);
		createRandomCaseGroup(
			randomGroup, m_context, "nested_structs_instance_arrays",
			"Nested structs, instance arrays, per-block buffers", m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK,
			allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS | FEATURE_INSTANCE_ARRAYS, 10,
			125);
		createRandomCaseGroup(randomGroup, m_context, "nested_structs_arrays_instance_arrays",
							  "Nested structs, instance arrays, per-block buffers", m_glslVersion,
							  UniformBlockCase::BUFFERMODE_PER_BLOCK,
							  allShaders | allLayouts | unused | allBasicTypes | matFlags | FEATURE_STRUCTS |
								  FEATURE_ARRAYS | FEATURE_INSTANCE_ARRAYS,
							  10, 175);

		createRandomCaseGroup(randomGroup, m_context, "all_per_block_buffers", "All random features, per-block buffers",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_PER_BLOCK, ~0u, 20, 200);
		createRandomCaseGroup(randomGroup, m_context, "all_shared_buffer", "All random features, shared buffer",
							  m_glslVersion, UniformBlockCase::BUFFERMODE_SINGLE, ~0u, 20, 250);
	}
}